

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

EmptyMemberSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::EmptyMemberSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>const&,slang::syntax::TokenList_const&,slang::parsing::Token&>
          (BumpAllocator *this,SyntaxList<slang::syntax::AttributeInstanceSyntax> *args,
          TokenList *args_1,Token *args_2)

{
  Token semi;
  EmptyMemberSyntax *this_00;
  
  this_00 = (EmptyMemberSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((EmptyMemberSyntax *)this->endPtr < this_00 + 1) {
    this_00 = (EmptyMemberSyntax *)allocateSlow(this,0x98,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  semi.kind = args_2->kind;
  semi._2_1_ = args_2->field_0x2;
  semi.numFlags.raw = (args_2->numFlags).raw;
  semi.rawLen = args_2->rawLen;
  semi.info = args_2->info;
  slang::syntax::EmptyMemberSyntax::EmptyMemberSyntax(this_00,args,args_1,semi);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }